

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O2

void __thiscall QtMWidgets::TextLabel::TextLabel(TextLabel *this,QWidget *parent,WindowFlags f)

{
  TextLabelPrivate *this_00;
  TextLabel *ctx;
  
  QFrame::QFrame();
  *(undefined ***)this = &PTR_metaObject_002ade38;
  *(undefined ***)&this->field_0x10 = &PTR__TextLabel_002adff0;
  this_00 = (TextLabelPrivate *)operator_new(0x28);
  ctx = this;
  TextLabelPrivate::TextLabelPrivate(this_00,this);
  (this->d).d = this_00;
  TextLabelPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

TextLabel::TextLabel( QWidget * parent, Qt::WindowFlags f )
	:	QFrame( parent, f )
	,	d( new TextLabelPrivate( this ) )
{
	d->init();
}